

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAM3PreOrOffsetIndexOp(MCInst *MI,uint Op,SStream *O,_Bool AlwaysPrintImm0)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  byte bVar3;
  ARM_AM_AddrOpc Op_00;
  uint uVar4;
  MCOperand *op;
  MCOperand *op_00;
  MCOperand *op_01;
  int64_t iVar5;
  char *pcVar6;
  uint ImmOffs;
  ARM_AM_AddrOpc sign;
  MCOperand *MO3;
  MCOperand *MO2;
  MCOperand *MO1;
  _Bool AlwaysPrintImm0_local;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,Op);
  op_00 = MCInst_getOperand(MI,Op + 1);
  op_01 = MCInst_getOperand(MI,Op + 2);
  iVar5 = MCOperand_getImm(op_01);
  Op_00 = getAM3Op((uint)iVar5);
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  pcVar2 = MI->csh;
  uVar4 = MCOperand_getReg(op);
  printRegName(pcVar2,O,uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar4 = MCOperand_getReg(op);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
  }
  uVar4 = MCOperand_getReg(op_00);
  if (uVar4 == 0) {
    iVar5 = MCOperand_getImm(op_01);
    bVar3 = getAM3Offset((uint)iVar5);
    uVar4 = (uint)bVar3;
    if (((AlwaysPrintImm0) || (uVar4 != 0)) || (Op_00 == ARM_AM_sub)) {
      if (uVar4 < 10) {
        pcVar6 = ARM_AM_getAddrOpcStr(Op_00);
        SStream_concat(O,", #%s%u",pcVar6);
      }
      else {
        pcVar6 = ARM_AM_getAddrOpcStr(Op_00);
        SStream_concat(O,", #%s0x%x",pcVar6);
      }
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      if (Op_00 == ARM_AM_sub) {
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x52) = -uVar4;
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x56] = '\x01';
      }
      else {
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x52) = uVar4;
      }
    }
    SStream_concat0(O,"]");
    set_mem_access(MI,false);
  }
  else {
    SStream_concat0(O,", ");
    pcVar6 = ARM_AM_getAddrOpcStr(Op_00);
    SStream_concat0(O,pcVar6);
    pcVar2 = MI->csh;
    uVar4 = MCOperand_getReg(op_00);
    printRegName(pcVar2,O,uVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar4 = MCOperand_getReg(op_00);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x4a) = uVar4;
      if (Op_00 == ARM_AM_sub) {
        puVar1 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x4e;
        puVar1[0] = 0xff;
        puVar1[1] = 0xff;
        puVar1[2] = 0xff;
        puVar1[3] = 0xff;
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x56] = '\x01';
      }
    }
    SStream_concat0(O,"]");
    set_mem_access(MI,false);
  }
  return;
}

Assistant:

static void printAM3PreOrOffsetIndexOp(MCInst *MI, unsigned Op, SStream *O,
		bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op+1);
	MCOperand *MO3 = MCInst_getOperand(MI, Op+2);
	ARM_AM_AddrOpc sign = getAM3Op((unsigned int)MCOperand_getImm(MO3));
	unsigned ImmOffs;

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);

	if (MCOperand_getReg(MO2)) {
		SStream_concat0(O, ", ");
		SStream_concat0(O, ARM_AM_getAddrOpcStr(sign));
		printRegName(MI->csh, O, MCOperand_getReg(MO2));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = MCOperand_getReg(MO2);
			if (!sign) {
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.scale = -1;
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = true;
			}
		}
		SStream_concat0(O, "]");
		set_mem_access(MI, false);
		return;
	}

	//If the op is sub we have to print the immediate even if it is 0
	ImmOffs = getAM3Offset((unsigned int)MCOperand_getImm(MO3));

	if (AlwaysPrintImm0 || ImmOffs || (sign == ARM_AM_sub)) {
		if (ImmOffs > HEX_THRESHOLD)
			SStream_concat(O, ", #%s0x%x", ARM_AM_getAddrOpcStr(sign), ImmOffs);
		else
			SStream_concat(O, ", #%s%u", ARM_AM_getAddrOpcStr(sign), ImmOffs);
	}

	if (MI->csh->detail) {
		if (!sign) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = -(int)ImmOffs;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = true;
		} else
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = (int)ImmOffs;
	}

	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}